

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty_printer.hpp
# Opt level: O3

value __thiscall trial::protocol::json::example::pretty_printer::symbol(pretty_printer *this)

{
  value vVar1;
  error *this_00;
  error_code eVar2;
  error_code ec;
  
  vVar1 = basic_reader<char>::symbol(this->reader);
  if (vVar1 != end) {
    return vVar1;
  }
  this_00 = (error *)__cxa_allocate_exception(0x20);
  eVar2 = detail::basic_decoder<char>::error(&this->reader->decoder);
  ec._M_cat = eVar2._M_cat;
  ec._4_4_ = 0;
  ec._M_value = eVar2._M_value;
  error::error(this_00,ec);
  __cxa_throw(this_00,&error::typeinfo,std::system_error::~system_error);
}

Assistant:

json::token::symbol::value symbol()
    {
        json::token::symbol::value token = reader.symbol();
        if (token == json::token::symbol::end)
            throw json::error(reader.error());
        return token;
    }